

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryUtilizationContainer.cpp
# Opt level: O0

void __thiscall
MemoryUtilizationContainer::MemoryUtilizationContainer(MemoryUtilizationContainer *this)

{
  int iVar1;
  UtilizationWidget *this_00;
  FlowGridLayout *pFVar2;
  GPUMemDetailsWidget *this_01;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  MemoryUtilizationContainer *local_10;
  MemoryUtilizationContainer *this_local;
  
  local_10 = this;
  UtilizationContainer::UtilizationContainer(&this->super_UtilizationContainer);
  *(undefined ***)&this->super_UtilizationContainer = &PTR_metaObject_00141788;
  *(undefined ***)&(this->super_UtilizationContainer).field_0x10 =
       &PTR__MemoryUtilizationContainer_00141938;
  this_00 = (UtilizationWidget *)operator_new(0x2868);
  MemoryUtilizationWidget::MemoryUtilizationWidget
            ((MemoryUtilizationWidget *)this_00,&this->super_UtilizationContainer);
  (this->super_UtilizationContainer).utilizationWidget = this_00;
  QString::QString((QString *)local_38,"Memory Utilization");
  UtilizationContainer::build(&this->super_UtilizationContainer,(QString *)local_38);
  QString::~QString((QString *)local_38);
  local_3c = 0;
  while( true ) {
    iVar1 = InfoProvider::getGPUCount();
    if (iVar1 <= local_3c) break;
    pFVar2 = UtilizationContainer::getDescLayout(&this->super_UtilizationContainer);
    this_01 = (GPUMemDetailsWidget *)operator_new(0x28);
    GPUMemDetailsWidget::GPUMemDetailsWidget(this_01,&this->super_UtilizationContainer,local_3c);
    QLayout::addWidget((QWidget *)pFVar2);
    local_3c = local_3c + 1;
  }
  UtilizationContainer::updateLegend(&this->super_UtilizationContainer);
  return;
}

Assistant:

MemoryUtilizationContainer::MemoryUtilizationContainer() {
    utilizationWidget = new MemoryUtilizationWidget(this);
    build("Memory Utilization");

    for (int i = 0; i < InfoProvider::getGPUCount(); i++)
        getDescLayout()->addWidget(new GPUMemDetailsWidget(this, i));

    updateLegend();
}